

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall
kj::HttpServer::Connection::sendWebSocketError::BrokenWebSocket::disconnect(BrokenWebSocket *this)

{
  char *pcVar1;
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar2;
  _func_int **local_178;
  char *pcStack_170;
  Exception local_168;
  
  Exception::Exception(&local_168,(Exception *)(in_RSI + 8));
  heap<kj::_::ImmediateBrokenPromiseNode,kj::Exception>((kj *)&local_178,&local_168);
  pcVar1 = pcStack_170;
  pcStack_170 = (char *)0x0;
  (this->super_WebSocket)._vptr_WebSocket = local_178;
  (this->exception).ownFile.content.ptr = pcVar1;
  Exception::~Exception(&local_168);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> disconnect() override {
        return kj::cp(exception);
      }